

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

ZSTD_compressionParameters *
ZSTD_adjustCParams_internal
          (ZSTD_compressionParameters cPar,unsigned_long_long srcSize,size_t dictSize,
          ZSTD_cParamMode_e mode,ZSTD_paramSwitch_e useRowMatchFinder)

{
  ZSTD_compressionParameters cParams;
  U32 UVar1;
  int iVar2;
  size_t sVar3;
  int in_ECX;
  ulong in_RDX;
  ulong in_RSI;
  ZSTD_compressionParameters *in_RDI;
  uint uStack0000000000000008;
  U32 UStack000000000000000c;
  uint uStack0000000000000010;
  uint uStack0000000000000014;
  uint uStack0000000000000018;
  uint uStack000000000000001c;
  ZSTD_strategy in_stack_00000020;
  U32 maxHashLog;
  U32 maxRowHashLog;
  U32 rowLog;
  U32 maxShortCacheHashLog;
  U32 cycleLog;
  U32 dictAndWindowLog;
  U32 srcLog;
  U32 tSize;
  U64 maxWindowResize;
  U64 minSrcSize;
  undefined8 uVar4;
  ZSTD_strategy ZVar5;
  undefined4 in_stack_ffffffffffffff84;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  U32 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  uint uVar6;
  ZSTD_strategy in_stack_ffffffffffffff98;
  ulong local_10;
  ulong local_8;
  
  cParams.chainLog = in_stack_ffffffffffffff84;
  cParams.windowLog = in_stack_00000020;
  cParams.hashLog = in_stack_ffffffffffffff88;
  cParams.searchLog = in_stack_ffffffffffffff8c;
  cParams.minMatch = in_stack_ffffffffffffff90;
  cParams.targetLength = in_stack_ffffffffffffff94;
  cParams.strategy = in_stack_ffffffffffffff98;
  uVar4 = _uStack0000000000000010;
  ZVar5 = in_stack_00000020;
  sVar3 = ZSTD_checkCParams(cParams);
  if (sVar3 != 0) {
    __assert_fail("ZSTD_checkCParams(cPar)==0",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x5675,
                  "ZSTD_compressionParameters ZSTD_adjustCParams_internal(ZSTD_compressionParameters, unsigned long long, size_t, ZSTD_cParamMode_e, ZSTD_paramSwitch_e)"
                 );
  }
  local_10 = in_RDX;
  local_8 = in_RSI;
  switch(in_ECX) {
  case 0:
  case 3:
    break;
  case 1:
    local_10 = 0;
    break;
  case 2:
    if ((in_RDX != 0) && (in_RSI == 0xffffffffffffffff)) {
      local_8 = 0x201;
    }
    break;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x568e,
                  "ZSTD_compressionParameters ZSTD_adjustCParams_internal(ZSTD_compressionParameters, unsigned long long, size_t, ZSTD_cParamMode_e, ZSTD_paramSwitch_e)"
                 );
  }
  if ((local_8 < 0x40000001) && (local_10 < 0x40000001)) {
    if ((uint)((int)local_8 + (int)local_10) < 0x40) {
      uVar6 = 6;
    }
    else {
      uVar6 = ZSTD_highbit32(0);
      uVar6 = uVar6 + 1;
    }
    if (uVar6 < uStack0000000000000008) {
      uStack0000000000000008 = uVar6;
    }
  }
  if (local_8 != 0xffffffffffffffff) {
    UVar1 = ZSTD_dictAndWindowLog
                      (in_stack_ffffffffffffff90,
                       CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                       CONCAT44(in_stack_ffffffffffffff84,ZVar5));
    ZSTD_cycleLog(UStack000000000000000c,in_stack_00000020);
    if (UVar1 + 1 < uStack0000000000000010) {
      uStack0000000000000010 = UVar1 + 1;
    }
  }
  if (uStack0000000000000008 < 10) {
    uStack0000000000000008 = 10;
  }
  if (((in_ECX == 2) &&
      (iVar2 = ZSTD_CDictIndicesAreTagged((ZSTD_compressionParameters *)&stack0x00000008),
      iVar2 != 0)) && (0x18 < uStack0000000000000010)) {
    uStack0000000000000010 = 0x18;
  }
  iVar2 = ZSTD_rowMatchFinderUsed(SUB84(uVar4,4),(ZSTD_paramSwitch_e)uVar4);
  if (iVar2 != 0) {
    uVar6 = uStack0000000000000014;
    if (5 < uStack0000000000000014) {
      uVar6 = 6;
    }
    if (uVar6 < 4) {
      uVar6 = 4;
    }
    else {
      uVar6 = uStack0000000000000014;
      if (5 < uStack0000000000000014) {
        uVar6 = 6;
      }
    }
    if (uStack0000000000000010 < uVar6) {
      __assert_fail("cPar.hashLog >= rowLog",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x56c4,
                    "ZSTD_compressionParameters ZSTD_adjustCParams_internal(ZSTD_compressionParameters, unsigned long long, size_t, ZSTD_cParamMode_e, ZSTD_paramSwitch_e)"
                   );
    }
    if (uVar6 + 0x18 < uStack0000000000000010) {
      uStack0000000000000010 = uVar6 + 0x18;
    }
  }
  in_RDI->windowLog = uStack0000000000000008;
  in_RDI->chainLog = UStack000000000000000c;
  in_RDI->hashLog = uStack0000000000000010;
  in_RDI->searchLog = uStack0000000000000014;
  in_RDI->minMatch = uStack0000000000000018;
  in_RDI->targetLength = uStack000000000000001c;
  in_RDI->strategy = in_stack_00000020;
  return in_RDI;
}

Assistant:

static ZSTD_compressionParameters
ZSTD_adjustCParams_internal(ZSTD_compressionParameters cPar,
                            unsigned long long srcSize,
                            size_t dictSize,
                            ZSTD_cParamMode_e mode,
                            ZSTD_paramSwitch_e useRowMatchFinder)
{
    const U64 minSrcSize = 513; /* (1<<9) + 1 */
    const U64 maxWindowResize = 1ULL << (ZSTD_WINDOWLOG_MAX-1);
    assert(ZSTD_checkCParams(cPar)==0);

    switch (mode) {
    case ZSTD_cpm_unknown:
    case ZSTD_cpm_noAttachDict:
        /* If we don't know the source size, don't make any
         * assumptions about it. We will already have selected
         * smaller parameters if a dictionary is in use.
         */
        break;
    case ZSTD_cpm_createCDict:
        /* Assume a small source size when creating a dictionary
         * with an unknown source size.
         */
        if (dictSize && srcSize == ZSTD_CONTENTSIZE_UNKNOWN)
            srcSize = minSrcSize;
        break;
    case ZSTD_cpm_attachDict:
        /* Dictionary has its own dedicated parameters which have
         * already been selected. We are selecting parameters
         * for only the source.
         */
        dictSize = 0;
        break;
    default:
        assert(0);
        break;
    }

    /* resize windowLog if input is small enough, to use less memory */
    if ( (srcSize <= maxWindowResize)
      && (dictSize <= maxWindowResize) )  {
        U32 const tSize = (U32)(srcSize + dictSize);
        static U32 const hashSizeMin = 1 << ZSTD_HASHLOG_MIN;
        U32 const srcLog = (tSize < hashSizeMin) ? ZSTD_HASHLOG_MIN :
                            ZSTD_highbit32(tSize-1) + 1;
        if (cPar.windowLog > srcLog) cPar.windowLog = srcLog;
    }
    if (srcSize != ZSTD_CONTENTSIZE_UNKNOWN) {
        U32 const dictAndWindowLog = ZSTD_dictAndWindowLog(cPar.windowLog, (U64)srcSize, (U64)dictSize);
        U32 const cycleLog = ZSTD_cycleLog(cPar.chainLog, cPar.strategy);
        if (cPar.hashLog > dictAndWindowLog+1) cPar.hashLog = dictAndWindowLog+1;
        if (cycleLog > dictAndWindowLog)
            cPar.chainLog -= (cycleLog - dictAndWindowLog);
    }

    if (cPar.windowLog < ZSTD_WINDOWLOG_ABSOLUTEMIN)
        cPar.windowLog = ZSTD_WINDOWLOG_ABSOLUTEMIN;  /* minimum wlog required for valid frame header */

    /* We can't use more than 32 bits of hash in total, so that means that we require:
     * (hashLog + 8) <= 32 && (chainLog + 8) <= 32
     */
    if (mode == ZSTD_cpm_createCDict && ZSTD_CDictIndicesAreTagged(&cPar)) {
        U32 const maxShortCacheHashLog = 32 - ZSTD_SHORT_CACHE_TAG_BITS;
        if (cPar.hashLog > maxShortCacheHashLog) {
            cPar.hashLog = maxShortCacheHashLog;
        }
        if (cPar.chainLog > maxShortCacheHashLog) {
            cPar.chainLog = maxShortCacheHashLog;
        }
    }


    /* At this point, we aren't 100% sure if we are using the row match finder.
     * Unless it is explicitly disabled, conservatively assume that it is enabled.
     * In this case it will only be disabled for small sources, so shrinking the
     * hash log a little bit shouldn't result in any ratio loss.
     */
    if (useRowMatchFinder == ZSTD_ps_auto)
        useRowMatchFinder = ZSTD_ps_enable;

    /* We can't hash more than 32-bits in total. So that means that we require:
     * (hashLog - rowLog + 8) <= 32
     */
    if (ZSTD_rowMatchFinderUsed(cPar.strategy, useRowMatchFinder)) {
        /* Switch to 32-entry rows if searchLog is 5 (or more) */
        U32 const rowLog = BOUNDED(4, cPar.searchLog, 6);
        U32 const maxRowHashLog = 32 - ZSTD_ROW_HASH_TAG_BITS;
        U32 const maxHashLog = maxRowHashLog + rowLog;
        assert(cPar.hashLog >= rowLog);
        if (cPar.hashLog > maxHashLog) {
            cPar.hashLog = maxHashLog;
        }
    }

    return cPar;
}